

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O0

void perf_get_msurf_descriptor
               (_func_void_integral_image_ptr_interest_point_ptr *function,integral_image *iimage,
               interest_point *ipoint,benchmark_data *data)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  iterator __first;
  iterator __last;
  reference pvVar3;
  long in_RCX;
  undefined8 in_RDX;
  long lVar4;
  undefined8 in_RSI;
  code *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double flops_per_cycle;
  size_t i_1;
  size_t j;
  double total_cycles;
  vector<double,_std::allocator<double>_> cycleslist;
  size_t i;
  uint64_t end;
  uint64_t start;
  double multiplier;
  long num_runs;
  double cycles;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *this;
  value_type_conflict *in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  ulong local_80;
  ulong local_78;
  double local_70;
  vector<double,_std::allocator<double>_> local_68;
  ulong local_50;
  unsigned_long_long local_48;
  unsigned_long_long local_40;
  double local_38;
  ulong local_30;
  double local_28;
  long local_20;
  undefined8 local_18;
  undefined8 local_10;
  code *local_8;
  
  local_28 = 0.0;
  local_30 = 100;
  local_38 = 1.0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    auVar7 = ZEXT864((ulong)((double)(long)local_30 * local_38));
    local_30 = (ulong)((double)(long)local_30 * local_38);
    local_40 = start_tsc();
    for (local_50 = 0; auVar5 = auVar7._0_16_, local_50 < local_30; local_50 = local_50 + 1) {
      auVar7._0_8_ = (*local_8)(local_10,local_18);
      auVar7._8_56_ = extraout_var;
    }
    local_48 = stop_tsc(local_40);
    auVar5 = vcvtusi2sd_avx512f(auVar5,local_48);
    local_28 = auVar5._0_8_;
    local_38 = 100000000.0 / local_28;
  } while (2.0 < local_38);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x11b0ec);
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  local_70 = 0.0;
  for (local_78 = 0; local_78 < 10; local_78 = local_78 + 1) {
    local_40 = start_tsc();
    for (local_80 = 0; auVar5 = auVar8._0_16_, local_80 < local_30; local_80 = local_80 + 1) {
      auVar8._0_8_ = (*local_8)(local_10,local_18);
      auVar8._8_56_ = extraout_var_00;
    }
    local_48 = stop_tsc(local_40);
    auVar5 = vcvtusi2sd_avx512f(auVar5,local_48);
    local_28 = auVar5._0_8_ / (double)(long)local_30;
    local_70 = local_70 + local_28;
    auVar8 = ZEXT864((ulong)local_70);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  local_28 = local_70 / 10.0;
  auVar6._0_8_ = ((double)*(long *)(local_20 + 0x210) * 100.0) / local_28;
  auVar6._8_8_ = 0;
  auVar11._8_8_ = 0x8000000000000000;
  auVar11._0_8_ = 0x8000000000000000;
  auVar9._8_8_ = 0x3fdfffffffffffff;
  auVar9._0_8_ = 0x3fdfffffffffffff;
  auVar5 = vpternlogq_avx512vl(auVar9,auVar6,auVar11,0xf8);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar6._0_8_ + auVar5._0_8_;
  auVar6 = vroundsd_avx(auVar6,auVar10,0xb);
  this = &local_68;
  __first = std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
  __last = std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff48);
  std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_28;
  lVar4 = vcvttsd2usi_avx512f(auVar5);
  *(long *)(local_20 + 0x218) = *(long *)(local_20 + 0x218) + lVar4;
  pvVar3 = std::vector<double,_std::allocator<double>_>::front(this);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *pvVar3;
  lVar4 = vcvttsd2usi_avx512f(auVar1);
  *(long *)(local_20 + 0x220) = *(long *)(local_20 + 0x220) + lVar4;
  pvVar3 = std::vector<double,_std::allocator<double>_>::back(this);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pvVar3;
  lVar4 = vcvttsd2usi_avx512f(auVar2);
  *(long *)(local_20 + 0x228) = lVar4 + *(long *)(local_20 + 0x228);
  *(double *)(local_20 + 0x230) = auVar6._0_8_ / 100.0 + *(double *)(local_20 + 0x230);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)__first._M_current);
  return;
}

Assistant:

void perf_get_msurf_descriptor(void (*function)(struct integral_image *, struct interest_point *),
                               struct integral_image *iimage, struct interest_point *ipoint,
                               struct benchmark_data &data) {
    double cycles = 0.;
    long num_runs = 100;
    double multiplier = 1;
    uint64_t start, end;

#ifdef WARM_UP
    // Warm-up phase: we determine a number of executions that allows
    // the code to be executed for at least CYCLES_REQUIRED cycles.
    // This helps excluding timing overhead when measuring small runtimes.
    do {
        num_runs = num_runs * multiplier;
        start = start_tsc();
        for (size_t i = 0; i < num_runs; i++) {
            (*function)(iimage, ipoint);
        }
        end = stop_tsc(start);

        cycles = (double)end;
        multiplier = (CYCLES_REQUIRED) / (cycles);

    } while (multiplier > 2);
#endif

    std::vector<double> cycleslist;

    // Actual performance measurements repeated REP times.
    // We simply store all results and compute medians during post-processing.
    double total_cycles = 0;
    for (size_t j = 0; j < REP; j++) {
        start = start_tsc();
        for (size_t i = 0; i < num_runs; ++i) {
            (*function)(iimage, ipoint);
        }
        end = stop_tsc(start);

        cycles = ((double)end) / num_runs;
        total_cycles += cycles;

        cycleslist.push_back(cycles);
    }
    total_cycles /= REP;

    cycles = total_cycles;  // cyclesList.front();
    double flops_per_cycle = round((100.0 * data.num_flops) / cycles) / 100.0;
    std::sort(cycleslist.begin(), cycleslist.end());
    data.avg_cycles += (uint64_t)cycles;
    data.min_cycles += (uint64_t)cycleslist.front();
    data.max_cycles += (uint64_t)cycleslist.back();
    data.flops_per_cycle += flops_per_cycle;
}